

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O0

Ref __thiscall trun::TestModule::ExecuteExit(TestModule *this,Ref *dynlib)

{
  bool bVar1;
  Config *pCVar2;
  element_type *dynlib_00;
  ResultSummary *this_00;
  shared_ptr<trun::IDynLibrary> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ref RVar4;
  shared_ptr<trun::TestFunc> local_68 [2];
  undefined8 local_48;
  CBPrePostHook local_40;
  CBPrePostHook local_38 [2];
  undefined1 local_21;
  shared_ptr<trun::IDynLibrary> *local_20;
  Ref *dynlib_local;
  TestModule *this_local;
  Ref *testResult;
  
  local_20 = in_RDX;
  dynlib_local = dynlib;
  this_local = this;
  bVar1 = std::operator==((shared_ptr<trun::TestFunc> *)(dynlib + 9),(nullptr_t)0x0);
  if (bVar1) {
    std::shared_ptr<trun::TestResult>::shared_ptr
              ((shared_ptr<trun::TestResult> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pCVar2 = Config::Instance();
    if ((pCVar2->testModuleGlobals & 1U) == 0) {
      std::shared_ptr<trun::TestResult>::shared_ptr
                ((shared_ptr<trun::TestResult> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      local_21 = 0;
      dynlib_00 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(dynlib + 9));
      std::shared_ptr<trun::IDynLibrary>::shared_ptr
                ((shared_ptr<trun::IDynLibrary> *)local_38,local_20);
      local_40.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
      local_48 = 0;
      TestFunc::Execute((TestFunc *)this,(Ref *)dynlib_00,local_38,&local_40);
      std::shared_ptr<trun::IDynLibrary>::~shared_ptr((shared_ptr<trun::IDynLibrary> *)local_38);
      bVar1 = std::operator==((shared_ptr<trun::TestResult> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_01;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = ResultSummary::Instance();
        std::shared_ptr<trun::TestFunc>::shared_ptr
                  (local_68,(shared_ptr<trun::TestFunc> *)(dynlib + 9));
        ResultSummary::AddResult(this_00,local_68);
        std::shared_ptr<trun::TestFunc>::~shared_ptr(local_68);
        _Var3._M_pi = extraout_RDX_02;
      }
    }
  }
  RVar4.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  RVar4.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref)RVar4.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestResult::Ref TestModule::ExecuteExit(const IDynLibrary::Ref &dynlib) {
    if (exitFunc == nullptr) return nullptr;
    if (!Config::Instance().testModuleGlobals) return nullptr;

    auto testResult = exitFunc->Execute(dynlib, {}, {});

    if (testResult != nullptr) {
        ResultSummary::Instance().AddResult(exitFunc);
    }
    return testResult;
}